

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::shift_left(char *ext,uint shift)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (shift != 0) {
    uVar1 = *(ushort *)ext;
    uVar9 = (ulong)uVar1;
    if ((shift & 1) == 0) {
      uVar5 = (ulong)(shift >> 1);
      uVar8 = (ulong)(uVar1 + 1 >> 1);
      uVar2 = uVar8 - uVar5;
      if (uVar8 < uVar5 || uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        pcVar4 = ext + 5;
        uVar7 = uVar8;
        do {
          *pcVar4 = pcVar4[uVar5];
          uVar7 = uVar7 - 1;
          pcVar4 = pcVar4 + 1;
        } while (uVar5 != uVar7);
      }
      if (uVar2 <= uVar8 && uVar8 - uVar2 != 0) {
        memset(ext + uVar2 + 5,0,uVar8 - uVar2);
      }
      ext[(uVar9 - shift >> 1) + 5] =
           ext[(uVar9 - shift >> 1) + 5] & '\x0f' << (((byte)uVar1 & 1) << 2);
    }
    else {
      uVar2 = (ulong)shift;
      if (shift < uVar1) {
        uVar5 = uVar9 - uVar2;
        iVar6 = shift * 4;
        uVar8 = 0;
        do {
          bVar3 = (byte)uVar8 & 1;
          ext[(uVar8 >> 1) + 5] =
               (byte)(((uint)(int)ext[(uVar2 + uVar8 >> 1) + 5] >> (~(byte)iVar6 & 4) & 0xf) <<
                     (bVar3 * '\x04' ^ 4)) | '\x0f' << (bVar3 << 2) & ext[(uVar8 >> 1) + 5];
          uVar8 = uVar8 + 1;
          iVar6 = iVar6 + 4;
        } while ((uVar2 - uVar9) + uVar8 != 0);
      }
      else {
        uVar5 = 0;
      }
      if (uVar5 < uVar9) {
        if (uVar2 < uVar9) {
          uVar2 = uVar9;
        }
        bVar3 = (char)uVar2 * '\x04' + (char)shift * -4;
        do {
          ext[(uVar5 >> 1) + 5] = ext[(uVar5 >> 1) + 5] & '\x0f' << (bVar3 & 4);
          uVar5 = uVar5 + 1;
          bVar3 = bVar3 + 4;
        } while (uVar9 != uVar5);
      }
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::shift_left(char *ext, unsigned int shift)
{
    size_t prec = get_prec(ext);
    size_t i;

    /* do nothing with a zero shift */
    if (shift == 0)
        return;

    /* if it's an even shift, it's especially easy */
    if ((shift & 1) == 0)
    {
        /* simply move the bytes left by the required amount */
        for (i = 0 ; i + shift/2 < (prec+1)/2 ; ++i)
            ext[VMBN_MANT + i] = ext[VMBN_MANT + i + shift/2];

        /* zero the remaining digits */
        for ( ; i < (prec+1)/2 ; ++i)
            ext[VMBN_MANT + i] = 0;

        /* 
         *   be sure to zero the last digit - if we have an odd precision, we
         *   will have copied the garbage digit from the final half-byte 
         */
        set_dig(ext, prec - shift, 0);
    }
    else
    {
        /* apply the shift to each digit */
        for (i = 0 ; i + shift < prec  ; ++i)
        {
            unsigned int dig;

            /* get this source digit */
            dig = get_dig(ext, i + shift);

            /* set this destination digit */
            set_dig(ext, i, dig);
        }

        /* zero the remaining digits */
        for ( ; i < prec ; ++i)
            set_dig(ext, i, 0);
    }
}